

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

int testMultiFunctionDefaultFunctionName(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  Rep *pRVar3;
  ModelDescription *interface;
  bool bVar4;
  ResultType RVar5;
  ostream *poVar6;
  FunctionDescription *obj;
  void *pvVar7;
  undefined8 *puVar8;
  int iVar9;
  Arena *arena;
  Model m;
  ValidationPolicy local_84;
  Result local_80;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58,(Arena *)0x0,false);
  local_84.allowsEmptyInput = true;
  local_84.allowsEmptyOutput = true;
  local_84.allowsMultipleFunctions = true;
  local_84.allowsStatefulPrediction = false;
  if (local_58.description_ == (ModelDescription *)0x0) {
    arena = (Arena *)(local_58.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_58.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena = *(Arena **)arena;
    }
    local_58.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>(arena)
    ;
  }
  interface = local_58.description_;
  uVar2 = ((local_58.description_)->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&(local_58.description_)->defaultfunctionname_,"foo",puVar8);
  CoreML::validateModelDescription(&local_80,interface,9,&local_84);
  bVar4 = CoreML::Result::good(&local_80);
  paVar1 = &local_80.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  else {
    CoreML::validateModelDescription(&local_80,interface,9,&local_84);
    RVar5 = CoreML::Result::type(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_80.m_message._M_dataplus._M_p,
                      local_80.m_message.field_2._M_allocated_capacity + 1);
    }
    if (RVar5 == INVALID_DEFAULT_FUNCTION_NAME) {
      pRVar3 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar3 == (Rep *)0x0) {
LAB_00142091:
        obj = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::FunctionDescription>
                        ((interface->functions_).super_RepeatedPtrFieldBase.arena_);
        pvVar7 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(interface->functions_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar9 = (interface->functions_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar3->allocated_size <= iVar9) goto LAB_00142091;
        (interface->functions_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
        pvVar7 = pRVar3->elements[iVar9];
      }
      puVar8 = (undefined8 *)(*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar7 + 8) & 1) != 0) {
        puVar8 = (undefined8 *)*puVar8;
      }
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                ((ArenaStringPtr *)((long)pvVar7 + 0x58),"bar",puVar8);
      CoreML::validateModelDescription(&local_80,interface,9,&local_84);
      bVar4 = CoreML::Result::good(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x134);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      }
      else {
        CoreML::validateModelDescription(&local_80,interface,9,&local_84);
        RVar5 = CoreML::Result::type(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.m_message._M_dataplus._M_p,
                          local_80.m_message.field_2._M_allocated_capacity + 1);
        }
        if (RVar5 == INVALID_DEFAULT_FUNCTION_NAME) {
          puVar8 = (undefined8 *)(*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffc);
          if ((*(ulong *)((long)pvVar7 + 8) & 1) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          google::protobuf::internal::ArenaStringPtr::
          Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    ((ArenaStringPtr *)((long)pvVar7 + 0x58),"foo",puVar8);
          CoreML::validateModelDescription(&local_80,interface,9,&local_84);
          bVar4 = CoreML::Result::good(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.m_message._M_dataplus._M_p,
                            local_80.m_message.field_2._M_allocated_capacity + 1);
          }
          iVar9 = 0;
          if (bVar4) goto LAB_0014239c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x137);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x134);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                     ,0x99);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        }
      }
      std::ostream::put((char)poVar6);
      iVar9 = 1;
      std::ostream::flush();
      goto LAB_0014239c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
               ,0x99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  }
  std::ostream::put((char)poVar6);
  iVar9 = 1;
  std::ostream::flush();
LAB_0014239c:
  CoreML::Specification::Model::~Model(&local_58);
  return iVar9;
}

Assistant:

int testMultiFunctionDefaultFunctionName() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    auto *function = description->add_functions();
    function->set_name("bar");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    function->set_name("foo");
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    return 0;
}